

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O0

void __thiscall
SwitchIRBuilder::SetProfiledInstruction(SwitchIRBuilder *this,Instr *instr,ProfileId profileId)

{
  bool bVar1;
  JITTimeProfileInfo *this_00;
  ProfiledInstr *pPVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar3;
  char16 *pcVar4;
  bool local_189;
  wchar local_188 [4];
  char16 debugStringBuffer [42];
  char local_128 [8];
  char valueTypeStr [256];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  bool local_1b;
  ProfileId local_1a;
  ValueType valueType;
  bool hasProfile;
  Instr *pIStack_18;
  ProfileId profileId_local;
  Instr *instr_local;
  SwitchIRBuilder *this_local;
  
  this->m_profiledSwitchInstr = instr;
  this->m_switchOptBuildBail = true;
  local_1a = profileId;
  pIStack_18 = instr;
  bVar1 = IR::Instr::IsProfiledInstr(this->m_profiledSwitchInstr);
  local_189 = false;
  if (bVar1) {
    local_189 = Func::HasProfileInfo(this->m_profiledSwitchInstr->m_func);
  }
  local_1b = local_189;
  if (local_189 != false) {
    this_00 = Func::GetReadOnlyProfileInfo(this->m_profiledSwitchInstr->m_func);
    local_1e.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         JITTimeProfileInfo::GetSwitchProfileInfo(this_00,local_1a);
    pPVar2 = IR::Instr::AsProfiledInstr(pIStack_18);
    paVar3 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
             IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                       ((anon_union_8_4_88fdcd80 *)&(pPVar2->u).field_3);
    paVar3->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_1e;
    bVar1 = ValueType::IsLikelyTaggedInt((ValueType *)&local_1e.field_0);
    this->m_switchIntDynProfile = bVar1;
    bVar1 = ValueType::IsLikelyString((ValueType *)&local_1e.field_0);
    this->m_switchStrDynProfile = bVar1;
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,SwitchOptPhase);
    if (bVar1) {
      ValueType::ToString((ValueType *)&local_1e.field_0,(char (*) [256])local_128);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,SwitchOptPhase);
      if (bVar1) {
        pcVar4 = Func::GetDebugNumberSet
                           (this->m_profiledSwitchInstr->m_func,(wchar (*) [42])local_188);
        pPVar2 = IR::Instr::AsProfiledInstr(this->m_profiledSwitchInstr);
        Output::Print(L"Func %s, Switch %d: Expression Type : %S\n",pcVar4,
                      (ulong)(pPVar2->u).profileId,local_128);
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void
SwitchIRBuilder::SetProfiledInstruction(IR::Instr * instr, Js::ProfileId profileId)
{
    m_profiledSwitchInstr = instr;
    m_switchOptBuildBail = true;

    //don't optimize if the switch expression is not an Integer (obtained via dynamic profiling data of the BeginSwitch opcode)

    bool hasProfile = m_profiledSwitchInstr->IsProfiledInstr() && m_profiledSwitchInstr->m_func->HasProfileInfo();

    if (hasProfile)
    {
        const ValueType valueType(m_profiledSwitchInstr->m_func->GetReadOnlyProfileInfo()->GetSwitchProfileInfo(profileId));
        instr->AsProfiledInstr()->u.FldInfo().valueType = valueType;
        m_switchIntDynProfile = valueType.IsLikelyTaggedInt();
        m_switchStrDynProfile = valueType.IsLikelyString();

        if (PHASE_TESTTRACE1(Js::SwitchOptPhase))
        {
            char valueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            valueType.ToString(valueTypeStr);
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            PHASE_PRINT_TESTTRACE1(Js::SwitchOptPhase, _u("Func %s, Switch %d: Expression Type : %S\n"),
                m_profiledSwitchInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                m_profiledSwitchInstr->AsProfiledInstr()->u.profileId, valueTypeStr);
        }
    }
}